

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86::create_pipeline(MultiHeadAttention_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  int *piVar2;
  void *pvVar3;
  long *plVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  Layer *pLVar21;
  long lVar22;
  float fVar23;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar24;
  undefined1 in_XMM1 [16];
  undefined1 auVar25 [16];
  ParamDict pd;
  Option opt1;
  undefined8 uStack_118;
  undefined8 auStack_10c [2];
  undefined8 uStack_f8;
  undefined1 auStack_f0 [8];
  undefined1 auStack_ec [8];
  undefined8 uStack_e4;
  Mat local_d8;
  void *local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  long *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_48;
  float local_34;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  
  fVar23 = (float)(*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]) /
                  *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auVar25._4_4_ = in_XMM0_Db;
  auVar25._0_4_ = fVar23;
  auVar25._8_4_ = in_XMM0_Dc;
  auVar25._12_4_ = in_XMM0_Dd;
  auVar25 = rsqrtss(in_XMM1,auVar25);
  fVar24 = auVar25._0_4_;
  local_34 = fVar24 * -0.5 * (fVar23 * fVar24 * fVar24 + -3.0);
  auStack_f0 = (undefined1  [8])0x519d52;
  pLVar21 = create_layer(0x4a);
  this->q_gemm = pLVar21;
  auStack_f0 = (undefined1  [8])0x519d61;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x519d74;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0,local_34);
  auStack_f0 = (undefined1  [8])0x519d89;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),1,1.0);
  auStack_f0 = (undefined1  [8])0x519d98;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x519daa;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x519dbc;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x519dcb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x519ddd;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x519df8;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x519e07;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x519e22;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x519e34;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x519e43;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x519e55;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x519e64;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x519e71;
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar22 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar22) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar22) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar22) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar22) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar22) = 0;
    lVar22 = lVar22 + 0x48;
  } while (lVar22 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0xe8 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0xf0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x519f06;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x519ef7;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0xe8 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf0 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf0 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf8 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf8 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x100 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x108 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x110 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var1);
    local_d8.c = *(int *)(&this->field_0x120 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x128 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_90 != (void **)(&this->field_0x130 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x519fe1;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x519fd2;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x130 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x138 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x138 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x140 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x140 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x148 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x150 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x158 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x160 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x168 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x170 + (long)p_Var1);
  }
  pLVar21 = this->q_gemm;
  auStack_f0 = (undefined1  [8])0x51a083;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51a095;
  (*pLVar21->_vptr_Layer[3])(pLVar21,&local_48);
  auStack_f0 = (undefined1  [8])0x51a0a2;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51a0af;
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0xf0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x108 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0xe8 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a100;
            free(*(void **)(&this->field_0xe8 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a0f1;
          (**(code **)(**(long **)(&this->field_0x108 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x128 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xfc + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xf0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x118 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x120 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a17f;
            free(*(void **)(&this->field_0x130 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a16d;
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
  }
  lVar22 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar22);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar22);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar22);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a1f3;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a1e1;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar22) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar22) = 0;
    lVar22 = lVar22 + -0x48;
  } while (lVar22 != -0x48);
  auStack_f0 = (undefined1  [8])0x51a22a;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51a234;
  pLVar21 = create_layer(0x4a);
  this->k_gemm = pLVar21;
  auStack_f0 = (undefined1  [8])0x51a243;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51a252;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51a264;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51a276;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x51a285;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51a297;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51a2b2;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x51a2c1;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51a2dc;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xdc + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x51a2ee;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x51a2fd;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51a30f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51a31e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x51a32b;
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar22 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar22) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar22) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar22) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar22) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar22) = 0;
    lVar22 = lVar22 + 0x48;
  } while (lVar22 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0x178 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x180 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a3bc;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a3ad;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x178 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x180 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x180 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x188 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x188 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x190 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x198 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1);
    local_d8.c = *(int *)(&this->field_0x1b0 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x1b8 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_90 != (void **)(&this->field_0x1c0 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x1c8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a499;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a48a;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x1c0 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x1d8 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x1e0 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x1f0 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x1f8 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x200 + (long)p_Var1);
  }
  pLVar21 = this->k_gemm;
  auStack_f0 = (undefined1  [8])0x51a53b;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51a54d;
  (*pLVar21->_vptr_Layer[3])(pLVar21,&local_48);
  auStack_f0 = (undefined1  [8])0x51a55a;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51a567;
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x180 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x198 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x178 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a5b8;
            free(*(void **)(&this->field_0x178 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a5a9;
          (**(code **)(**(long **)(&this->field_0x198 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x18c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1b0 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x1c8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x1e0 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x1c0 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a637;
            free(*(void **)(&this->field_0x1c0 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a625;
          (**(code **)(**(long **)(&this->field_0x1e0 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x200 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1cc + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1d4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1c0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1c8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1f0 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1f8 + (long)p_Var1) = 0;
  }
  lVar22 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar22);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar22);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar22);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a6ab;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a699;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar22) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar22) = 0;
    lVar22 = lVar22 + -0x48;
  } while (lVar22 != -0x48);
  auStack_f0 = (undefined1  [8])0x51a6e2;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51a6ec;
  pLVar21 = create_layer(0x4a);
  this->v_gemm = pLVar21;
  auStack_f0 = (undefined1  [8])0x51a6fb;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51a70a;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51a71c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51a72e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x51a73d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51a74f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51a76a;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x51a779;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51a794;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xe0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x51a7a6;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x51a7b5;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51a7c7;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51a7d6;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x51a7e3;
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar22 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar22) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar22) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar22) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar22) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar22) = 0;
    lVar22 = lVar22 + 0x48;
  } while (lVar22 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0x208 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x210 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a874;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a865;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x208 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x210 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x210 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x218 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x218 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x220 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x228 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x230 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x238 + (long)p_Var1);
    local_d8.c = *(int *)(&this->field_0x240 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x248 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_90 != (void **)(&this->field_0x250 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x258 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51a951;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51a942;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x250 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x258 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x258 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x260 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x260 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x268 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x270 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x278 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x280 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x288 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x290 + (long)p_Var1);
  }
  pLVar21 = this->v_gemm;
  auStack_f0 = (undefined1  [8])0x51a9f0;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51aa01;
  (*pLVar21->_vptr_Layer[3])(pLVar21,&local_48);
  auStack_f0 = (undefined1  [8])0x51aa0e;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51aa1b;
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x210 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x228 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x208 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51aa6a;
            free(*(void **)(&this->field_0x208 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51aa5b;
          (**(code **)(**(long **)(&this->field_0x228 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x248 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x214 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x21c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x208 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x210 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x230 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x238 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x240 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x258 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x270 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x250 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51aae4;
            free(*(void **)(&this->field_0x250 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51aad2;
          (**(code **)(**(long **)(&this->field_0x270 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x290 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x25c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x264 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x250 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x258 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x278 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x280 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x288 + (long)p_Var1) = 0;
  }
  lVar22 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar22);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar22);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar22);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51ab55;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51ab43;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar22) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar22) = 0;
    lVar22 = lVar22 + -0x48;
  } while (lVar22 != -0x48);
  auStack_f0 = (undefined1  [8])0x51ab8c;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51ab96;
  pLVar21 = create_layer(0x4a);
  this->qk_gemm = pLVar21;
  auStack_f0 = (undefined1  [8])0x51aba5;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51abb7;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,1);
  auStack_f0 = (undefined1  [8])0x51abc6;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,0);
  auStack_f0 = (undefined1  [8])0x51abd5;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x51abe4;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51ac05;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,
                 (uint)(*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3])
                       == 0));
  auStack_f0 = (undefined1  [8])0x51ac14;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x51ac23;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51ac34;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,0);
  auStack_f0 = (undefined1  [8])0x51ac57;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,
                 -(uint)(*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3])
                        == 0) | 3);
  auStack_f0 = (undefined1  [8])0x51ac66;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51ac78;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51ac85;
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar21 = this->qk_gemm;
  auStack_f0 = (undefined1  [8])0x51ac95;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x51aca3;
  (*pLVar21->_vptr_Layer[3])(pLVar21,&local_d8);
  auStack_f0 = (undefined1  [8])0x51acb0;
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  local_d8.refcount._0_4_ = *(undefined4 *)&opt->blob_allocator;
  local_d8.refcount._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  uVar5 = opt->openmp_blocktime;
  uVar6 = opt->use_winograd_convolution;
  uVar8 = opt->use_sgemm_convolution;
  uVar10 = opt->use_int8_inference;
  uVar12 = opt->use_vulkan_compute;
  uVar11 = CONCAT11(uVar12,uVar10);
  uVar9 = CONCAT21(uVar11,uVar8);
  uVar7 = CONCAT31(uVar9,uVar6);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
  local_d8._48_8_ = *(undefined8 *)&opt->flush_denormals;
  local_d8.c._0_1_ = opt->use_winograd43_convolution;
  local_d8.c._1_1_ = opt->use_winograd63_convolution;
  local_d8.c._2_1_ = opt->use_a53_a55_optimized_kernel;
  local_d8.c._3_1_ = opt->use_reserved_7;
  local_d8._60_1_ = opt->use_reserved_8;
  local_d8._61_1_ = opt->use_reserved_9;
  local_d8._62_1_ = opt->use_reserved_10;
  local_d8._63_1_ = opt->use_reserved_11;
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data = (void *)CONCAT44(1,*(undefined4 *)opt);
  auStack_f0 = (undefined1  [8])0x51aced;
  local_d8.elempack = uVar5;
  local_d8._28_4_ = uVar7;
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&local_d8);
  auStack_f0 = (undefined1  [8])0x51acf5;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51acff;
  pLVar21 = create_layer(0x4a);
  this->qkv_gemm = pLVar21;
  auStack_f0 = (undefined1  [8])0x51ad0e;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51ad1d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x51ad2f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51ad3e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x51ad4d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x51ad5f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51ad6e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x51ad7d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x51ad8c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,0);
  auStack_f0 = (undefined1  [8])0x51ad9e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,-1);
  auStack_f0 = (undefined1  [8])0x51adad;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51adbf;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x51add1;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,1);
  auStack_f0 = (undefined1  [8])0x51adde;
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar21 = this->qkv_gemm;
  auStack_f0 = (undefined1  [8])0x51adee;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x51adfc;
  (*pLVar21->_vptr_Layer[3])(pLVar21,&local_d8);
  auStack_f0 = (undefined1  [8])0x51ae09;
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  local_d8.refcount._0_4_ = *(undefined4 *)&opt->blob_allocator;
  local_d8.refcount._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  uVar13 = opt->openmp_blocktime;
  uVar14 = opt->use_winograd_convolution;
  uVar16 = opt->use_sgemm_convolution;
  uVar18 = opt->use_int8_inference;
  uVar20 = opt->use_vulkan_compute;
  uVar19 = CONCAT11(uVar20,uVar18);
  uVar17 = CONCAT21(uVar19,uVar16);
  uVar15 = CONCAT31(uVar17,uVar14);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
  local_d8._48_8_ = *(undefined8 *)&opt->flush_denormals;
  local_d8.c._0_1_ = opt->use_winograd43_convolution;
  local_d8.c._1_1_ = opt->use_winograd63_convolution;
  local_d8.c._2_1_ = opt->use_a53_a55_optimized_kernel;
  local_d8.c._3_1_ = opt->use_reserved_7;
  local_d8._60_1_ = opt->use_reserved_8;
  local_d8._61_1_ = opt->use_reserved_9;
  local_d8._62_1_ = opt->use_reserved_10;
  local_d8._63_1_ = opt->use_reserved_11;
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data = (void *)CONCAT44(1,*(undefined4 *)opt);
  auStack_f0 = (undefined1  [8])0x51ae46;
  local_d8.elempack = uVar13;
  local_d8._28_4_ = uVar15;
  (*this->qkv_gemm->_vptr_Layer[4])();
  auStack_f0 = (undefined1  [8])0x51ae4e;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51ae58;
  pLVar21 = create_layer(0x20);
  this->qk_softmax = pLVar21;
  auStack_f0 = (undefined1  [8])0x51ae69;
  ParamDict::ParamDict((ParamDict *)&local_d8);
  auStack_f0 = (undefined1  [8])0x51ae78;
  ParamDict::set((ParamDict *)&local_d8,0,-1);
  auStack_f0 = (undefined1  [8])0x51ae8c;
  ParamDict::set((ParamDict *)&local_d8,1,1);
  auStack_f0 = (undefined1  [8])0x51ae9b;
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar21 = this->qk_softmax;
  auStack_f0 = (undefined1  [8])0x51aea9;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),
             (Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x51aeb5;
  (*pLVar21->_vptr_Layer[3])(pLVar21,(undefined1 *)((long)register0x00000020 + -0xec) + 4);
  auStack_f0 = (undefined1  [8])0x51aebd;
  ModelBinFromMatArray::~ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51aeca;
  (*this->qk_softmax->_vptr_Layer[4])(this->qk_softmax,opt);
  auStack_f0 = (undefined1  [8])0x51aed7;
  ParamDict::~ParamDict((ParamDict *)&local_d8);
  auStack_f0 = (undefined1  [8])0x51aee1;
  pLVar21 = create_layer(0x4a);
  this->o_gemm = pLVar21;
  auStack_f0 = (undefined1  [8])0x51aef0;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x51af02;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,1);
  auStack_f0 = (undefined1  [8])0x51af14;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x51af23;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x51af35;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,1);
  auStack_f0 = (undefined1  [8])0x51af47;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x51af56;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x51af71;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x51af8c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auStack_f0 = (undefined1  [8])0x51af9e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,4);
  auStack_f0 = (undefined1  [8])0x51afad;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x51afba;
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar22 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar22) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22) = 0;
    *(undefined8 *)((long)auStack_10c + lVar22 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar22) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar22) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar22) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar22) = 0;
    lVar22 = lVar22 + 0x48;
  } while (lVar22 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0x298 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x2a0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51b04b;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51b03c;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x298 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x2b0 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x2b8 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x2c0 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x2c8 + (long)p_Var1);
    local_d8.c = *(int *)(&this->field_0x2d0 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x2d8 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_90 != (void **)(&this->field_0x2e0 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x2e8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51b128;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51b119;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x2e0 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x2f8 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x300 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x308 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x310 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x318 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x320 + (long)p_Var1);
  }
  pLVar21 = this->o_gemm;
  auStack_f0 = (undefined1  [8])0x51b1c7;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x51b1d8;
  (*pLVar21->_vptr_Layer[3])(pLVar21,&local_48);
  auStack_f0 = (undefined1  [8])0x51b1e5;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x51b1f2;
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x2a0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x2b8 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x298 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51b241;
            free(*(void **)(&this->field_0x298 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51b232;
          (**(code **)(**(long **)(&this->field_0x2b8 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x2d8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2a4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2ac + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x298 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2c0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2c8 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x2d0 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar2 = *(int **)(&this->field_0x2e8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x300 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x2e0 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51b2bb;
            free(*(void **)(&this->field_0x2e0 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51b2a9;
          (**(code **)(**(long **)(&this->field_0x300 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x320 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2ec + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2f4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2e0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2e8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x308 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x310 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x318 + (long)p_Var1) = 0;
  }
  lVar22 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar22);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar22);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar22);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x51b32b;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x51b319;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar22 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar22) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar22) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar22) = 0;
    lVar22 = lVar22 + -0x48;
  } while (lVar22 != -0x48);
  auStack_f0 = (undefined1  [8])0x51b362;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  return 0;
}

Assistant:

int MultiHeadAttention_x86::create_pipeline(const Option& opt)
{
    {
        const int embed_dim_per_head = embed_dim / num_heads;
        const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

        q_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, inv_sqrt_embed_dim_per_head);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, embed_dim); // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        q_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        k_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        v_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }
    {
        qkv_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    {
        qk_softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    {
        o_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, embed_dim); // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        o_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    return 0;
}